

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<float> * __thiscall
tinyusdz::XformOp::get_value<float>
          (optional<float> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<float> local_34;
  float local_28;
  TimeSampleInterpolationType local_24;
  float value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  local_24 = interp;
  _value = t;
  t_local = (double)this;
  this_local = (XformOp *)__return_storage_ptr__;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<float>(this,&local_28,_value,local_24);
    if (bVar1) {
      nonstd::optional_lite::optional<float>::optional<float,_0>(__return_storage_ptr__,&local_28);
    }
    else {
      nonstd::optional_lite::optional<float>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<float>(&local_34,&this->_var);
    nonstd::optional_lite::optional<float>::optional<float,_0>(__return_storage_ptr__,&local_34);
    nonstd::optional_lite::optional<float>::~optional(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }